

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait.cpp
# Opt level: O2

DWORD WaitForSingleObject(HANDLE hHandle,DWORD dwMilliseconds)

{
  DWORD DVar1;
  CPalThread *pThread;
  HANDLE local_20;
  HANDLE hHandle_local;
  
  local_20 = hHandle;
  if (PAL_InitializeChakraCoreCalled) {
    pThread = CorUnix::InternalGetCurrentThread();
    DVar1 = CorUnix::InternalWaitForMultipleObjectsEx(pThread,1,&local_20,0,dwMilliseconds,0);
    if (PAL_InitializeChakraCoreCalled != false) {
      return DVar1;
    }
  }
  abort();
}

Assistant:

DWORD
PALAPI
WaitForSingleObject(IN HANDLE hHandle,
                    IN DWORD dwMilliseconds)
{
    DWORD dwRet;

    PERF_ENTRY(WaitForSingleObject);
    ENTRY("WaitForSingleObject(hHandle=%p, dwMilliseconds=%u)\n",
          hHandle, dwMilliseconds);

    CPalThread * pThread = InternalGetCurrentThread();

    dwRet = InternalWaitForMultipleObjectsEx(pThread, 1, &hHandle, FALSE,
                                             dwMilliseconds, FALSE);

    LOGEXIT("WaitForSingleObject returns DWORD %u\n", dwRet);
    PERF_EXIT(WaitForSingleObject);
    return dwRet;
}